

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TACBuilderVisitor.cpp
# Opt level: O2

void __thiscall
hdc::TACBuilderVisitor::visit(TACBuilderVisitor *this,LiteralIntegerExpression *expression)

{
  int tmp;
  string *psVar1;
  string local_a0;
  undefined1 local_80 [48];
  Token token;
  
  token.lexem._M_dataplus._M_p = (pointer)&token.lexem.field_2;
  token.lexem._M_string_length = 0;
  token.lexem.field_2._M_local_buf[0] = '\0';
  LiteralExpression::get_token((Token *)local_80,&expression->super_LiteralExpression);
  Token::operator=(&token,(Token *)local_80);
  std::__cxx11::string::~string((string *)(local_80 + 0x10));
  tmp = this->tempCounter;
  this->lastTemporary = tmp;
  this->tempCounter = tmp + 1;
  psVar1 = Token::getLexem_abi_cxx11_(&token);
  std::__cxx11::string::string((string *)&local_a0,(string *)psVar1);
  emit(this,TAC_CONST_I32,tmp,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&token.lexem);
  return;
}

Assistant:

void TACBuilderVisitor::visit(LiteralIntegerExpression* expression) {
    Token token;

    token = expression->get_token();
    emit(TAC_CONST_I32, newTemporary(), token.getLexem());
}